

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirread.c
# Opt level: O3

uint16_t TIFFFetchDirectory(TIFF *tif,uint64_t diroff,TIFFDirEntry **pdir,uint64_t *nextdiroff)

{
  toff_t off;
  int iVar1;
  uint uVar2;
  tmsize_t tVar3;
  TIFFDirEntry *p;
  ulong uVar4;
  TIFFDirEntry *pTVar5;
  long lVar6;
  char *fmt;
  char *pcVar7;
  ushort uVar8;
  uint16_t *wp;
  uint16_t dircount16;
  uint64_t dircount64;
  ushort local_42;
  undefined8 local_40;
  TIFFDirEntry *local_38;
  
  if (pdir == (TIFFDirEntry **)0x0) {
    __assert_fail("pdir",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_dirread.c"
                  ,0x167a,
                  "uint16_t TIFFFetchDirectory(TIFF *, uint64_t, TIFFDirEntry **, uint64_t *)");
  }
  tif->tif_diroff = diroff;
  if (nextdiroff != (uint64_t *)0x0) {
    *nextdiroff = 0;
  }
  off = tif->tif_diroff;
  if ((tif->tif_flags >> 0xb & 1) == 0) {
    iVar1 = _TIFFSeekOK(tif,off);
    if (iVar1 == 0) {
      pcVar7 = tif->tif_name;
      fmt = "%s: Seek error accessing TIFF directory";
    }
    else {
      if ((tif->tif_flags & 0x80000) != 0) {
        tVar3 = (*tif->tif_readproc)(tif->tif_clientdata,&local_40,8);
        if (tVar3 != 8) {
          TIFFErrorExtR(tif,"TIFFFetchDirectory","%s: Can not read TIFF directory count",
                        tif->tif_name);
          return 0;
        }
        if ((tif->tif_flags & 0x80) != 0) {
          TIFFSwabLong8(&local_40);
        }
        uVar4 = CONCAT44(local_40._4_4_,(uint)local_40);
        if (0x1000 < uVar4) {
LAB_0028fb05:
          pcVar7 = "Sanity check on directory count failed, this is probably not a valid IFD offset"
          ;
LAB_0028fb13:
          TIFFErrorExtR(tif,"TIFFFetchDirectory",pcVar7);
          return 0;
        }
        local_42 = (ushort)(uint)local_40;
        tVar3 = 0x14;
LAB_0028f981:
        p = (TIFFDirEntry *)_TIFFCheckMalloc(tif,uVar4 & 0xffff,tVar3,"to read TIFF directory");
        if (p == (TIFFDirEntry *)0x0) {
          return 0;
        }
        uVar4 = (*tif->tif_readproc)(tif->tif_clientdata,p,(ulong)local_42 * (long)tVar3);
        if (uVar4 != (uint)local_42 * (int)tVar3) {
          TIFFErrorExtR(tif,"TIFFFetchDirectory","%.100s: Can not read TIFF directory",tif->tif_name
                       );
          goto LAB_0028fbc4;
        }
        if (nextdiroff == (uint64_t *)0x0) goto LAB_0028fcdb;
        if ((tif->tif_flags & 0x80000) == 0) {
          tVar3 = (*tif->tif_readproc)(tif->tif_clientdata,&local_40,4);
          if (tVar3 != 4) {
            local_40._0_4_ = 0;
          }
          if ((tif->tif_flags & 0x80) != 0) {
LAB_0028fa08:
            TIFFSwabLong((uint32_t *)&local_40);
          }
LAB_0028fa12:
          *nextdiroff = (ulong)(uint)local_40;
          goto LAB_0028fcdb;
        }
        tVar3 = (*tif->tif_readproc)(tif->tif_clientdata,nextdiroff,8);
        if (tVar3 != 8) {
          *nextdiroff = 0;
        }
        if ((tif->tif_flags & 0x80) == 0) goto LAB_0028fcdb;
LAB_0028fcd3:
        TIFFSwabLong8(nextdiroff);
LAB_0028fcdb:
        pTVar5 = (TIFFDirEntry *)_TIFFCheckMalloc(tif,(ulong)local_42,0x20,"to read TIFF directory")
        ;
        local_38 = pTVar5;
        if (pTVar5 == (TIFFDirEntry *)0x0) {
          _TIFFfreeExt(tif,p);
          return 0;
        }
        if (local_42 != 0) {
          uVar8 = 0;
          wp = &p->tdir_tag;
          do {
            pTVar5->tdir_ignore = '\0';
            uVar2 = tif->tif_flags;
            if ((char)uVar2 < '\0') {
              TIFFSwabShort(wp);
              uVar2 = tif->tif_flags;
              pTVar5->tdir_tag = *wp;
              if ((char)uVar2 < '\0') {
                TIFFSwabShort(wp + 1);
                uVar2 = tif->tif_flags;
              }
            }
            else {
              pTVar5->tdir_tag = *wp;
            }
            pTVar5->tdir_type = wp[1];
            if ((uVar2 >> 0x13 & 1) == 0) {
              if ((char)uVar2 < '\0') {
                TIFFSwabLong((uint32_t *)(wp + 2));
              }
              pTVar5->tdir_count = (ulong)*(uint *)(wp + 2);
              (pTVar5->tdir_offset).toff_long8 = 0;
              (pTVar5->tdir_offset).toff_long = *(uint32_t *)(wp + 4);
              lVar6 = 0xc;
            }
            else {
              if ((char)uVar2 < '\0') {
                TIFFSwabLong8((uint64_t *)(wp + 2));
              }
              pTVar5->tdir_count = *(uint64_t *)(wp + 2);
              pTVar5->tdir_offset = *(anon_union_8_3_50a3d880_for_tdir_offset *)(wp + 6);
              lVar6 = 0x14;
            }
            wp = (uint16_t *)((long)wp + lVar6);
            pTVar5 = pTVar5 + 1;
            uVar8 = uVar8 + 1;
          } while (uVar8 < local_42);
        }
        _TIFFfreeExt(tif,p);
        *pdir = local_38;
        return local_42;
      }
      tVar3 = (*tif->tif_readproc)(tif->tif_clientdata,&local_42,2);
      if (tVar3 == 2) {
        if ((tif->tif_flags & 0x80) != 0) {
          TIFFSwabShort(&local_42);
        }
        uVar4 = (ulong)local_42;
        if (local_42 < 0x1001) {
          tVar3 = 0xc;
          goto LAB_0028f981;
        }
LAB_0028fabf:
        pcVar7 = "Sanity check on directory count failed, this is probably not a valid IFD offset";
        goto LAB_0028f90e;
      }
      pcVar7 = tif->tif_name;
      fmt = "%s: Can not read TIFF directory count";
    }
    TIFFErrorExtR(tif,"TIFFFetchDirectory",fmt,pcVar7);
  }
  else {
    if ((long)off < 0) {
LAB_0028f900:
      pcVar7 = "Can not read TIFF directory count";
    }
    else {
      if ((tif->tif_flags >> 0x13 & 1) == 0) {
        if ((0x7ffffffffffffffd < off) || (lVar6 = off + 2, tif->tif_size < lVar6))
        goto LAB_0028f900;
        _TIFFmemcpy(&local_42,tif->tif_base + off,2);
        if ((tif->tif_flags & 0x80) != 0) {
          TIFFSwabShort(&local_42);
        }
        uVar4 = (ulong)local_42;
        if (0x1000 < local_42) goto LAB_0028fabf;
        tVar3 = 0xc;
      }
      else {
        if ((0x7ffffffffffffff7 < off) || (lVar6 = off + 8, tif->tif_size < lVar6)) {
          pcVar7 = "Can not read TIFF directory count";
          goto LAB_0028fb13;
        }
        _TIFFmemcpy(&local_40,tif->tif_base + off,8);
        if ((tif->tif_flags & 0x80) != 0) {
          TIFFSwabLong8(&local_40);
        }
        uVar4 = CONCAT44(local_40._4_4_,(uint)local_40);
        if (0x1000 < uVar4) goto LAB_0028fb05;
        local_42 = (ushort)(uint)local_40;
        tVar3 = 0x14;
      }
      if ((short)uVar4 != 0) {
        local_38 = (TIFFDirEntry *)
                   _TIFFCheckMalloc(tif,uVar4 & 0xffff,tVar3,"to read TIFF directory");
        if (local_38 == (TIFFDirEntry *)0x0) {
          return 0;
        }
        uVar4 = (ulong)((uint)local_42 * (int)tVar3);
        if (tif->tif_size < (long)(uVar4 + lVar6)) {
          TIFFErrorExtR(tif,"TIFFFetchDirectory","Can not read TIFF directory");
          p = local_38;
LAB_0028fbc4:
          _TIFFfreeExt(tif,p);
          return 0;
        }
        _TIFFmemcpy(local_38,tif->tif_base + lVar6,uVar4);
        p = local_38;
        if (nextdiroff == (uint64_t *)0x0) goto LAB_0028fcdb;
        uVar4 = lVar6 + (ulong)((int)tVar3 * (uint)local_42);
        uVar2 = tif->tif_flags;
        if ((uVar2 >> 0x13 & 1) == 0) {
          if ((uVar4 < 0x7ffffffffffffffc) && ((long)(uVar4 + 4) <= tif->tif_size)) {
            _TIFFmemcpy(&local_40,tif->tif_base + uVar4,4);
            uVar2 = tif->tif_flags;
          }
          else {
            local_40._0_4_ = 0;
          }
          if ((char)uVar2 < '\0') goto LAB_0028fa08;
          goto LAB_0028fa12;
        }
        if ((uVar4 < 0x7ffffffffffffff8) && ((long)(uVar4 + 8) <= tif->tif_size)) {
          _TIFFmemcpy(nextdiroff,tif->tif_base + uVar4,8);
          uVar2 = tif->tif_flags;
        }
        else {
          *nextdiroff = 0;
        }
        if (-1 < (char)uVar2) goto LAB_0028fcdb;
        goto LAB_0028fcd3;
      }
      pcVar7 = "Sanity check on directory count failed, zero tag directories not supported";
    }
LAB_0028f90e:
    TIFFErrorExtR(tif,"TIFFFetchDirectory",pcVar7);
  }
  return 0;
}

Assistant:

static uint16_t TIFFFetchDirectory(TIFF *tif, uint64_t diroff,
                                   TIFFDirEntry **pdir, uint64_t *nextdiroff)
{
    static const char module[] = "TIFFFetchDirectory";

    void *origdir;
    uint16_t dircount16;
    uint32_t dirsize;
    TIFFDirEntry *dir;
    uint8_t *ma;
    TIFFDirEntry *mb;
    uint16_t n;

    assert(pdir);

    tif->tif_diroff = diroff;
    if (nextdiroff)
        *nextdiroff = 0;
    if (!isMapped(tif))
    {
        if (!SeekOK(tif, tif->tif_diroff))
        {
            TIFFErrorExtR(tif, module,
                          "%s: Seek error accessing TIFF directory",
                          tif->tif_name);
            return 0;
        }
        if (!(tif->tif_flags & TIFF_BIGTIFF))
        {
            if (!ReadOK(tif, &dircount16, sizeof(uint16_t)))
            {
                TIFFErrorExtR(tif, module,
                              "%s: Can not read TIFF directory count",
                              tif->tif_name);
                return 0;
            }
            if (tif->tif_flags & TIFF_SWAB)
                TIFFSwabShort(&dircount16);
            if (dircount16 > 4096)
            {
                TIFFErrorExtR(tif, module,
                              "Sanity check on directory count failed, this is "
                              "probably not a valid IFD offset");
                return 0;
            }
            dirsize = 12;
        }
        else
        {
            uint64_t dircount64;
            if (!ReadOK(tif, &dircount64, sizeof(uint64_t)))
            {
                TIFFErrorExtR(tif, module,
                              "%s: Can not read TIFF directory count",
                              tif->tif_name);
                return 0;
            }
            if (tif->tif_flags & TIFF_SWAB)
                TIFFSwabLong8(&dircount64);
            if (dircount64 > 4096)
            {
                TIFFErrorExtR(tif, module,
                              "Sanity check on directory count failed, this is "
                              "probably not a valid IFD offset");
                return 0;
            }
            dircount16 = (uint16_t)dircount64;
            dirsize = 20;
        }
        origdir = _TIFFCheckMalloc(tif, dircount16, dirsize,
                                   "to read TIFF directory");
        if (origdir == NULL)
            return 0;
        if (!ReadOK(tif, origdir, (tmsize_t)(dircount16 * dirsize)))
        {
            TIFFErrorExtR(tif, module, "%.100s: Can not read TIFF directory",
                          tif->tif_name);
            _TIFFfreeExt(tif, origdir);
            return 0;
        }
        /*
         * Read offset to next directory for sequential scans if
         * needed.
         */
        if (nextdiroff)
        {
            if (!(tif->tif_flags & TIFF_BIGTIFF))
            {
                uint32_t nextdiroff32;
                if (!ReadOK(tif, &nextdiroff32, sizeof(uint32_t)))
                    nextdiroff32 = 0;
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong(&nextdiroff32);
                *nextdiroff = nextdiroff32;
            }
            else
            {
                if (!ReadOK(tif, nextdiroff, sizeof(uint64_t)))
                    *nextdiroff = 0;
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong8(nextdiroff);
            }
        }
    }
    else
    {
        tmsize_t m;
        tmsize_t off;
        if (tif->tif_diroff > (uint64_t)INT64_MAX)
        {
            TIFFErrorExtR(tif, module, "Can not read TIFF directory count");
            return (0);
        }
        off = (tmsize_t)tif->tif_diroff;

        /*
         * Check for integer overflow when validating the dir_off,
         * otherwise a very high offset may cause an OOB read and
         * crash the client. Make two comparisons instead of
         *
         *  off + sizeof(uint16_t) > tif->tif_size
         *
         * to avoid overflow.
         */
        if (!(tif->tif_flags & TIFF_BIGTIFF))
        {
            m = off + sizeof(uint16_t);
            if ((m < off) || (m < (tmsize_t)sizeof(uint16_t)) ||
                (m > tif->tif_size))
            {
                TIFFErrorExtR(tif, module, "Can not read TIFF directory count");
                return 0;
            }
            else
            {
                _TIFFmemcpy(&dircount16, tif->tif_base + off, sizeof(uint16_t));
            }
            off += sizeof(uint16_t);
            if (tif->tif_flags & TIFF_SWAB)
                TIFFSwabShort(&dircount16);
            if (dircount16 > 4096)
            {
                TIFFErrorExtR(tif, module,
                              "Sanity check on directory count failed, this is "
                              "probably not a valid IFD offset");
                return 0;
            }
            dirsize = 12;
        }
        else
        {
            uint64_t dircount64;
            m = off + sizeof(uint64_t);
            if ((m < off) || (m < (tmsize_t)sizeof(uint64_t)) ||
                (m > tif->tif_size))
            {
                TIFFErrorExtR(tif, module, "Can not read TIFF directory count");
                return 0;
            }
            else
            {
                _TIFFmemcpy(&dircount64, tif->tif_base + off, sizeof(uint64_t));
            }
            off += sizeof(uint64_t);
            if (tif->tif_flags & TIFF_SWAB)
                TIFFSwabLong8(&dircount64);
            if (dircount64 > 4096)
            {
                TIFFErrorExtR(tif, module,
                              "Sanity check on directory count failed, this is "
                              "probably not a valid IFD offset");
                return 0;
            }
            dircount16 = (uint16_t)dircount64;
            dirsize = 20;
        }
        if (dircount16 == 0)
        {
            TIFFErrorExtR(tif, module,
                          "Sanity check on directory count failed, zero tag "
                          "directories not supported");
            return 0;
        }
        origdir = _TIFFCheckMalloc(tif, dircount16, dirsize,
                                   "to read TIFF directory");
        if (origdir == NULL)
            return 0;
        m = off + dircount16 * dirsize;
        if ((m < off) || (m < (tmsize_t)(dircount16 * dirsize)) ||
            (m > tif->tif_size))
        {
            TIFFErrorExtR(tif, module, "Can not read TIFF directory");
            _TIFFfreeExt(tif, origdir);
            return 0;
        }
        else
        {
            _TIFFmemcpy(origdir, tif->tif_base + off, dircount16 * dirsize);
        }
        if (nextdiroff)
        {
            off += dircount16 * dirsize;
            if (!(tif->tif_flags & TIFF_BIGTIFF))
            {
                uint32_t nextdiroff32;
                m = off + sizeof(uint32_t);
                if ((m < off) || (m < (tmsize_t)sizeof(uint32_t)) ||
                    (m > tif->tif_size))
                    nextdiroff32 = 0;
                else
                    _TIFFmemcpy(&nextdiroff32, tif->tif_base + off,
                                sizeof(uint32_t));
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong(&nextdiroff32);
                *nextdiroff = nextdiroff32;
            }
            else
            {
                m = off + sizeof(uint64_t);
                if ((m < off) || (m < (tmsize_t)sizeof(uint64_t)) ||
                    (m > tif->tif_size))
                    *nextdiroff = 0;
                else
                    _TIFFmemcpy(nextdiroff, tif->tif_base + off,
                                sizeof(uint64_t));
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong8(nextdiroff);
            }
        }
    }
    dir = (TIFFDirEntry *)_TIFFCheckMalloc(
        tif, dircount16, sizeof(TIFFDirEntry), "to read TIFF directory");
    if (dir == 0)
    {
        _TIFFfreeExt(tif, origdir);
        return 0;
    }
    ma = (uint8_t *)origdir;
    mb = dir;
    for (n = 0; n < dircount16; n++)
    {
        mb->tdir_ignore = FALSE;
        if (tif->tif_flags & TIFF_SWAB)
            TIFFSwabShort((uint16_t *)ma);
        mb->tdir_tag = *(uint16_t *)ma;
        ma += sizeof(uint16_t);
        if (tif->tif_flags & TIFF_SWAB)
            TIFFSwabShort((uint16_t *)ma);
        mb->tdir_type = *(uint16_t *)ma;
        ma += sizeof(uint16_t);
        if (!(tif->tif_flags & TIFF_BIGTIFF))
        {
            if (tif->tif_flags & TIFF_SWAB)
                TIFFSwabLong((uint32_t *)ma);
            mb->tdir_count = (uint64_t)(*(uint32_t *)ma);
            ma += sizeof(uint32_t);
            mb->tdir_offset.toff_long8 = 0;
            *(uint32_t *)(&mb->tdir_offset) = *(uint32_t *)ma;
            ma += sizeof(uint32_t);
        }
        else
        {
            if (tif->tif_flags & TIFF_SWAB)
                TIFFSwabLong8((uint64_t *)ma);
            mb->tdir_count = TIFFReadUInt64(ma);
            ma += sizeof(uint64_t);
            mb->tdir_offset.toff_long8 = TIFFReadUInt64(ma);
            ma += sizeof(uint64_t);
        }
        mb++;
    }
    _TIFFfreeExt(tif, origdir);
    *pdir = dir;
    return dircount16;
}